

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

int Fra_ClausProcessClauses2(Clu_Man_t *p,int fRefs)

{
  Vec_Ptr_t *p_00;
  Aig_Man_t *pAVar1;
  int *piVar2;
  int iVar3;
  Fra_Sml_t *pSeq;
  Fra_Sml_t *p_01;
  Aig_ManCut_t *p_02;
  abctime aVar4;
  void *pvVar5;
  abctime aVar6;
  sat_solver *psVar7;
  int Entry;
  int iVar8;
  char *__s;
  Aig_Cut_t *pCut;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uint local_8054;
  int ScoresComb [4096];
  int ScoresSeq [4096];
  
  if (0xc < p->nLutSize) {
    __assert_fail("p->nLutSize < 13",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                  ,0x2de,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
  }
  Abc_Clock();
  Aig_ManRandom(1);
  pSeq = Fra_SmlSimulateSeq(p->pAig,0,p->nPref + p->nSimFrames,p->nSimWords / p->nSimFrames,1);
  if ((p->fTarget == 0) || (pSeq->fNonConstOut == 0)) {
    Abc_Clock();
    iVar8 = 1;
    Aig_ManRandom(1);
    iVar12 = 0;
    p_01 = Fra_SmlSimulateComb(p->pAig,p->nSimWordsPref + p->nSimWords,0);
    Abc_Clock();
    if (fRefs != 0) {
      Fra_ClausCollectLatchClauses(p,pSeq);
    }
    Abc_Clock();
    p_02 = Aig_ComputeCuts(p->pAig,p->nCutsMax,p->nLutSize,0,p->fVerbose);
    aVar4 = Abc_Clock();
    local_8054 = 0;
    for (; p_00 = p->pAig->vObjs, iVar12 < p_00->nSize; iVar12 = iVar12 + 1) {
      pvVar5 = Vec_PtrEntry(p_00,iVar12);
      if (((pvVar5 != (void *)0x0) &&
          (0xfffffffd < ((uint)*(undefined8 *)((long)pvVar5 + 0x18) & 7) - 7)) &&
         (((uint)((ulong)*(undefined8 *)((long)pvVar5 + 0x18) >> 0x20) & 0xffffff) <=
          (uint)p->nLevels)) {
        pCut = p_02->pCuts[*(int *)((long)pvVar5 + 0x24)];
        for (iVar13 = 0; iVar13 < p_02->nCutsMax; iVar13 = iVar13 + 1) {
          if ('\x01' < pCut->nFanins) {
            Fra_ClausProcessClausesCut3(p,pSeq,pCut,ScoresSeq);
            Fra_ClausProcessClausesCut3(p,p_01,pCut,ScoresComb);
            for (lVar10 = 0; lVar10 < 1 << (pCut->nFanins & 0x1fU); lVar10 = lVar10 + 1) {
              if ((ScoresComb[lVar10] != 0) && (ScoresSeq[lVar10] == 0)) {
                Fra_ClausRecordClause2(p,pCut,(int)lVar10,ScoresComb[lVar10]);
              }
            }
            local_8054 = local_8054 + 1;
          }
          pCut = (Aig_Cut_t *)((long)&pCut->pNext + (long)pCut->nCutSize);
        }
      }
    }
    Fra_SmlStop(pSeq);
    Fra_SmlStop(p_01);
    p->nCuts = local_8054;
    Aig_ManCutStop(p_02);
    pAVar1 = p->pAig;
    pAVar1->pManCuts = (void *)0x0;
    if (p->fVerbose != 0) {
      iVar12 = 0x7db06a;
      printf("Node = %5d. Cuts = %7d. Clauses = %6d. Clause/cut = %6.2f.\n",
             (double)p->vClauses->nSize / (double)(int)local_8054,
             (ulong)(uint)(pAVar1->nObjs[6] + pAVar1->nObjs[5]),(ulong)local_8054);
      Abc_Print(iVar12,"%s =","Processing sim-info to find candidate clauses (unoptimized)");
      aVar6 = Abc_Clock();
      Abc_Print(iVar12,"%9.2f sec\n",(double)(aVar6 - aVar4) / 1000000.0);
    }
    if (p->nClauses != 0) {
      __assert_fail("p->nClauses == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                    ,0x331,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
    }
    iVar12 = p->vClauses->nSize;
    p->nClauses = iVar12;
    if (p->vClausesProven->nSize < 1) {
LAB_004f6b42:
      p->fFiltering = 0;
      if (p->nClausesMax < iVar12) {
        Fra_ClausSelectClauses(p);
        p->fFiltering = 1;
      }
    }
    else {
      if (p->pSatMain != (sat_solver *)0x0) {
        sat_solver_delete(p->pSatMain);
      }
      iVar12 = 0;
      psVar7 = (sat_solver *)Cnf_DataWriteIntoSolver(p->pCnf,1,0);
      p->pSatMain = psVar7;
      if (psVar7 == (sat_solver *)0x0) {
        __s = "Error: Main solver is unsat.";
      }
      else {
        piVar2 = p->vLitsProven->pArray;
        iVar13 = -1;
        iVar9 = 0;
        do {
          if (p->vClausesProven->nSize <= iVar12) {
            if (iVar13 != p->vLitsProven->nSize) {
              __assert_fail("End == Vec_IntSize(p->vLitsProven)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                            ,0x350,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
            }
            piVar2 = p->vLits->pArray;
            iVar9 = 0;
            iVar12 = 0;
            while( true ) {
              iVar3 = p->vClauses->nSize;
              if (iVar3 <= iVar9) break;
              iVar13 = Vec_IntEntry(p->vClauses,iVar9);
              iVar3 = Vec_IntEntry(p->vCosts,iVar9);
              if (iVar3 < 0) {
                __assert_fail("Vec_IntEntry( p->vCosts, i ) >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                              ,0x357,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
              }
              if (p->nLutSize < iVar13 - iVar12) {
                __assert_fail("End - Beg <= p->nLutSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                              ,0x358,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
              }
              lVar14 = (long)iVar13;
              lVar11 = (long)iVar12;
              for (lVar10 = lVar11; lVar10 < lVar14; lVar10 = lVar10 + 1) {
                *(byte *)(piVar2 + lVar10) = *(byte *)(piVar2 + lVar10) ^ 1;
              }
              iVar12 = sat_solver_solve(p->pSatMain,piVar2 + lVar11,piVar2 + lVar14,
                                        (long)p->nBTLimit,0,0,0);
              for (; lVar11 < lVar14; lVar11 = lVar11 + 1) {
                *(byte *)(piVar2 + lVar11) = *(byte *)(piVar2 + lVar11) ^ 1;
              }
              if (iVar12 == -1) {
                Vec_IntWriteEntry(p->vCosts,iVar9,Entry);
                p->nClauses = p->nClauses + -1;
              }
              iVar9 = iVar9 + 1;
              iVar12 = iVar13;
            }
            if (iVar13 != p->vLits->nSize) {
              __assert_fail("End == Vec_IntSize(p->vLits)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                            ,0x367,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
            }
            iVar12 = p->nClauses;
            if (p->fVerbose != 0) {
              printf("Already proved clauses filtered out %d candidate clauses (out of %d).\n",
                     (ulong)(uint)(iVar3 - iVar12));
              iVar12 = p->nClauses;
            }
            goto LAB_004f6b42;
          }
          iVar13 = Vec_IntEntry(p->vClausesProven,iVar12);
          if (p->nLutSize < iVar13 - iVar9) {
            __assert_fail("End - Beg <= p->nLutSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                          ,0x346,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
          }
          iVar3 = sat_solver_addclause(p->pSatMain,piVar2 + iVar9,piVar2 + iVar13);
          iVar12 = iVar12 + 1;
          iVar9 = iVar13;
        } while (iVar3 != 0);
        __s = "Error: Solver is UNSAT after adding assumption clauses.";
      }
      puts(__s);
      iVar8 = -1;
    }
  }
  else {
    puts("Property failed after sequential simulation!");
    Fra_SmlStop(pSeq);
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int Fra_ClausProcessClauses2( Clu_Man_t * p, int fRefs )
{
//    Aig_MmFixed_t * pMemCuts;
    Aig_ManCut_t * pManCut;
    Fra_Sml_t * pComb, * pSeq;
    Aig_Obj_t * pObj;
    Aig_Cut_t * pCut;
    int i, k, j, nCuts = 0;
    abctime clk;
    int ScoresSeq[1<<12], ScoresComb[1<<12];
    assert( p->nLutSize < 13 );

    // simulate the AIG
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pSeq = Fra_SmlSimulateSeq( p->pAig, 0, p->nPref + p->nSimFrames, p->nSimWords/p->nSimFrames, 1  );
    if ( p->fTarget && pSeq->fNonConstOut )
    {
        printf( "Property failed after sequential simulation!\n" );
        Fra_SmlStop( pSeq );
        return 0;
    }
if ( p->fVerbose )
{
//ABC_PRT( "Sim-seq", Abc_Clock() - clk );
}

    // perform combinational simulation
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pComb = Fra_SmlSimulateComb( p->pAig, p->nSimWords + p->nSimWordsPref, 0 );
if ( p->fVerbose )
{
//ABC_PRT( "Sim-cmb", Abc_Clock() - clk );
}


clk = Abc_Clock();
    if ( fRefs )
    {
    Fra_ClausCollectLatchClauses( p, pSeq );
if ( p->fVerbose )
{
//ABC_PRT( "Lat-cla", Abc_Clock() - clk );
}
    }


    // generate cuts for all nodes, assign cost, and find best cuts
clk = Abc_Clock();
//    pMemCuts = Dar_ManComputeCuts( p->pAig, 10, 0, 1 );
    pManCut = Aig_ComputeCuts( p->pAig, p->nCutsMax, p->nLutSize, 0, p->fVerbose );
if ( p->fVerbose )
{
//ABC_PRT( "Cuts   ", Abc_Clock() - clk );
}

    // collect combinational info for each cut
clk = Abc_Clock();
    Aig_ManForEachNode( p->pAig, pObj, i )
    {
        if ( pObj->Level > (unsigned)p->nLevels )
            continue;
        Aig_ObjForEachCut( pManCut, pObj, pCut, k )
            if ( pCut->nFanins > 1 )
            {
                nCuts++;
                Fra_ClausProcessClausesCut3( p, pSeq, pCut, ScoresSeq );
                Fra_ClausProcessClausesCut3( p, pComb, pCut, ScoresComb );
                // write the clauses
                for ( j = 0; j < (1<<pCut->nFanins); j++ )
                    if ( ScoresComb[j] != 0 && ScoresSeq[j] == 0 )
                        Fra_ClausRecordClause2( p, pCut, j, ScoresComb[j] );

            }
    }
    Fra_SmlStop( pSeq );
    Fra_SmlStop( pComb );
    p->nCuts = nCuts;
//    Aig_MmFixedStop( pMemCuts, 0 );
    Aig_ManCutStop( pManCut );
    p->pAig->pManCuts = NULL;

    if ( p->fVerbose )
    {
    printf( "Node = %5d. Cuts = %7d. Clauses = %6d. Clause/cut = %6.2f.\n", 
        Aig_ManNodeNum(p->pAig), nCuts, Vec_IntSize(p->vClauses), 1.0*Vec_IntSize(p->vClauses)/nCuts );
    ABC_PRT( "Processing sim-info to find candidate clauses (unoptimized)", Abc_Clock() - clk );
    }

    // filter out clauses that are contained in the already proven clauses
    assert( p->nClauses == 0 );
    p->nClauses = Vec_IntSize( p->vClauses );
    if ( Vec_IntSize( p->vClausesProven ) > 0 )
    {
        int RetValue, k, Beg;
        int End = -1; // Suppress "might be used uninitialized"
        int * pStart;
        // reset the solver
        if ( p->pSatMain )  sat_solver_delete( p->pSatMain );
        p->pSatMain = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, 1, 0 );
        if ( p->pSatMain == NULL )
        {
            printf( "Error: Main solver is unsat.\n" );
            return -1;
        }  

        // add the proven clauses
        Beg = 0;
        pStart = Vec_IntArray(p->vLitsProven);
        Vec_IntForEachEntry( p->vClausesProven, End, i )
        {
            assert( End - Beg <= p->nLutSize );
            // add the clause to all timeframes
            RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
                return -1;
            }
            Beg = End;
        }
        assert( End == Vec_IntSize(p->vLitsProven) );

        // check the clauses
        Beg = 0;
        pStart = Vec_IntArray(p->vLits);
        Vec_IntForEachEntry( p->vClauses, End, i )
        {
            assert( Vec_IntEntry( p->vCosts, i ) >= 0 );
            assert( End - Beg <= p->nLutSize );
            // check the clause
            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );
            RetValue = sat_solver_solve( p->pSatMain, pStart + Beg, pStart + End, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );
            // the clause holds
            if ( RetValue == l_False )
            {
                Vec_IntWriteEntry( p->vCosts, i, -1 );
                p->nClauses--;
            }
            Beg = End;
        }
        assert( End == Vec_IntSize(p->vLits) );
        if ( p->fVerbose )
        printf( "Already proved clauses filtered out %d candidate clauses (out of %d).\n", 
            Vec_IntSize(p->vClauses) - p->nClauses, Vec_IntSize(p->vClauses) );
    }

    p->fFiltering = 0;
    if ( p->nClauses > p->nClausesMax )
    {
        Fra_ClausSelectClauses( p );
        p->fFiltering = 1;
    }
    return 1;
}